

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

char * Diligent::GetRenderDeviceTypeShortString(RENDER_DEVICE_TYPE DeviceType,bool Capital)

{
  char *pcVar1;
  char *pcVar2;
  string msg;
  string local_28;
  
  switch(DeviceType) {
  case RENDER_DEVICE_TYPE_UNDEFINED:
    pcVar2 = "UNDEFINED";
    pcVar1 = "undefined";
    break;
  case RENDER_DEVICE_TYPE_D3D11:
    pcVar2 = "D3D11";
    pcVar1 = "d3d11";
    break;
  case RENDER_DEVICE_TYPE_D3D12:
    pcVar2 = "D3D12";
    pcVar1 = "d3d12";
    break;
  case RENDER_DEVICE_TYPE_GL:
    pcVar2 = "GL";
    pcVar1 = "gl";
    break;
  case RENDER_DEVICE_TYPE_GLES:
    pcVar2 = "GLES";
    pcVar1 = "gles";
    break;
  case RENDER_DEVICE_TYPE_VULKAN:
    pcVar2 = "VK";
    pcVar1 = "vk";
    break;
  case RENDER_DEVICE_TYPE_METAL:
    pcVar2 = "MTL";
    pcVar1 = "mtl";
    break;
  case RENDER_DEVICE_TYPE_WEBGPU:
    pcVar2 = "WGPU";
    pcVar1 = "wgpu";
    break;
  default:
    FormatString<char[32]>(&local_28,(char (*) [32])"Unknown/unsupported device type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetRenderDeviceTypeShortString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x649);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    return "UNKNOWN";
  }
  if (Capital) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char* GetRenderDeviceTypeShortString(RENDER_DEVICE_TYPE DeviceType, bool Capital)
{
    static_assert(RENDER_DEVICE_TYPE_COUNT == 8, "Did you add a new device type? Please update the switch below.");
    switch (DeviceType)
    {
        // clang-format off
        case RENDER_DEVICE_TYPE_UNDEFINED: return Capital ? "UNDEFINED" : "undefined"; break;
        case RENDER_DEVICE_TYPE_D3D11:     return Capital ? "D3D11"     : "d3d11";     break;
        case RENDER_DEVICE_TYPE_D3D12:     return Capital ? "D3D12"     : "d3d12";     break;
        case RENDER_DEVICE_TYPE_GL:        return Capital ? "GL"        : "gl";        break;
        case RENDER_DEVICE_TYPE_GLES:      return Capital ? "GLES"      : "gles";      break;
        case RENDER_DEVICE_TYPE_VULKAN:    return Capital ? "VK"        : "vk";        break;
        case RENDER_DEVICE_TYPE_METAL:     return Capital ? "MTL"       : "mtl";       break;
        case RENDER_DEVICE_TYPE_WEBGPU:    return Capital ? "WGPU"      : "wgpu";      break;
        // clang-format on
        default: UNEXPECTED("Unknown/unsupported device type"); return "UNKNOWN";
    }
}